

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNAct.h
# Opt level: O1

void __thiscall NaPNActor::~NaPNActor(NaPNActor *this)

{
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNActor_00174cb8;
  NaPetriCnInput::~NaPetriCnInput(&this->sync);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  operator_delete(this,0xa0);
  return;
}

Assistant:

class PNNA_API NaPNActor : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNActor (const char* szNodeName = "actor");

    ////////////////
    // Connectors //
    ////////////////

    // Input sync stream (mainstream)
    NaPetriCnInput      sync;

    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();


    ///////////////////
    // Node specific //
    ///////////////////

    // Setup some external procedure and its argument to call
    // on data ready
    virtual void        set_action (NaActionProc ap, void* ud);

    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

protected:/* data */

    // Action procedure pointer
    NaActionProc        pActionProc;

    // User data to pass to action proc
    void                *pUserData;

}